

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O2

void pstack::
     print_container<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char_const&>
               (ostream *os,long *container,char *ctx)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  ostream *os_00;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *field;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  JSON<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  local_40;
  
  std::operator<<(os,"[ ");
  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)container[1];
  pcVar2 = "";
  for (pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*container;
      pbVar3 != pbVar1; pbVar3 = pbVar3 + 1) {
    os_00 = std::operator<<(os,pcVar2);
    local_40.object = pbVar3;
    local_40.context = ctx;
    operator<<(os_00,&local_40);
    pcVar2 = ",\n";
  }
  std::operator<<(os," ]");
  return;
}

Assistant:

void print_container(std::ostream &os, const Container &container, Context &&ctx, std::false_type)
{
   os << "[ ";
   const char *sep = "";
   for (const auto &field : container) {
      os << sep << json(field, ctx);
      sep = ",\n";
   }
   os << " ]";
}